

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

void * mdns_string_make(void *data,size_t capacity,char *name,size_t length)

{
  uchar *__n;
  size_t __n_00;
  bool bVar1;
  size_t sublength_1;
  size_t sublength;
  uchar *dest;
  size_t remain;
  size_t last_pos;
  size_t pos;
  size_t length_local;
  char *name_local;
  size_t capacity_local;
  void *data_local;
  
  last_pos = 0;
  remain = 0;
  sublength = (size_t)data;
  dest = (uchar *)capacity;
  while( true ) {
    bVar1 = false;
    if (remain < length) {
      last_pos = mdns_string_find(name,length,'.',remain);
      bVar1 = last_pos != 0xffffffffffffffff;
    }
    if (!bVar1) break;
    __n = (uchar *)(last_pos - remain);
    if (dest <= __n) {
      return (void *)0x0;
    }
    *(char *)sublength = (char)__n;
    memcpy((void *)(sublength + 1),name + remain,(size_t)__n);
    sublength = (size_t)(__n + sublength + 1);
    dest = dest + -(long)(__n + 1);
    remain = last_pos + 1;
  }
  if (remain < length) {
    __n_00 = length - remain;
    if (capacity <= __n_00) {
      return (void *)0x0;
    }
    *(char *)sublength = (char)__n_00;
    memcpy((void *)(sublength + 1),name + remain,__n_00);
    sublength = __n_00 + 1 + sublength;
    dest = dest + -(__n_00 + 1);
  }
  if (dest == (uchar *)0x0) {
    return (void *)0x0;
  }
  *(undefined1 *)sublength = 0;
  return (void *)(sublength + 1);
}

Assistant:

void*
mdns_string_make(void* data, size_t capacity, const char* name, size_t length) {
	size_t pos = 0;
	size_t last_pos = 0;
	size_t remain = capacity;
	unsigned char* dest = (unsigned char*)data;
	while ((last_pos < length) && ((pos = mdns_string_find(name, length, '.', last_pos)) != MDNS_INVALID_POS)) {
		size_t sublength = pos - last_pos;
		if (sublength < remain) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
		last_pos = pos + 1;
	}
	if (last_pos < length) {
		size_t sublength = length - last_pos;
		if (sublength < capacity) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
	}
	if (!remain)
		return 0;
	*dest++ = 0;
	return dest;
}